

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O2

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               *src)

{
  bool bVar1;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  undefined1 local_38 [24];
  other local_20;
  
  local_38._0_8_ = dest->ptr;
  local_38._8_8_ = dest->height;
  local_38._16_8_ = dest->width;
  local_20._vptr_memory_manager_stateless_kernel_1 = (_func_int **)vpextrq_avx(local_38._8_16_,1);
  bVar1 = matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
          ::aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                    ((matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
                      *)src,(matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                            local_38);
  if (bVar1) {
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            *)local_38,dest->height,dest->width);
    matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
              ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)local_38,src,1.0,false,false);
    matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (dest,(matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                     *)local_38);
    row_major_layout::layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::
    ~layout((layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *)local_38);
  }
  else {
    matrix_assign_blas_proxy<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
              (dest,src,1.0,false,false);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }